

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O3

m2v * m2v_make(m2v *__return_storage_ptr__,int n_row,int n_col,m2v_base *memory)

{
  int iVar1;
  
  __return_storage_ptr__->n_row = n_row;
  __return_storage_ptr__->n_col = n_col;
  iVar1 = n_col + 0x3e;
  if (-1 < n_col + 0x1f) {
    iVar1 = n_col + 0x1f;
  }
  __return_storage_ptr__->row_stride = iVar1 >> 5;
  __return_storage_ptr__->e = memory;
  return __return_storage_ptr__;
}

Assistant:

m2v m2v_make(int n_row, int n_col, m2v_base* memory)
{
	m2v ret;
	ret.n_row = n_row;
	ret.n_col = n_col;

	ret.row_stride = m2v_get_row_size(n_col);
	ret.e = memory;

	return ret;
}